

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall
testing::internal::ExecDeathTest::ExecDeathTest
          (ExecDeathTest *this,char *a_statement,
          Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *matcher,char *file,int line)

{
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_30;
  
  local_30.vtable_ =
       (matcher->
       super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
       ).vtable_;
  local_30.buffer_ =
       (matcher->
       super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
       ).buffer_;
  (matcher->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).vtable_ = (VTable *)0x0;
  local_30.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0014c768;
  ForkingDeathTest::ForkingDeathTest
            (&this->super_ForkingDeathTest,a_statement,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_30);
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_30);
  (this->super_ForkingDeathTest).super_DeathTestImpl.super_DeathTest._vptr_DeathTest =
       (_func_int **)&PTR__DeathTestImpl_0014c488;
  this->file_ = file;
  this->line_ = line;
  return;
}

Assistant:

ExecDeathTest(const char* a_statement, Matcher<const std::string&> matcher,
                const char* file, int line)
      : ForkingDeathTest(a_statement, std::move(matcher)),
        file_(file),
        line_(line) {}